

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixelshuffle.cpp
# Opt level: O1

int __thiscall
ncnn::PixelShuffle::forward(PixelShuffle *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  int _c;
  int iVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  long lVar14;
  undefined4 *puVar15;
  ulong uVar16;
  undefined4 *puVar17;
  ulong uVar18;
  int iVar19;
  ulong local_90;
  ulong local_80;
  undefined4 *local_78;
  undefined4 *local_68;
  
  iVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  iVar11 = this->upscale_factor;
  uVar10 = (long)bottom_blob->c / (long)(iVar11 * iVar11);
  _c = (int)uVar10;
  Mat::create(top_blob,iVar11 * iVar1,uVar2 * iVar11,_c,bottom_blob->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < _c) {
      local_68 = (undefined4 *)top_blob->data;
      sVar5 = top_blob->elemsize;
      uVar3 = this->upscale_factor;
      sVar6 = top_blob->cstep;
      lVar14 = (long)top_blob->w * sVar5;
      local_90 = 0;
      do {
        if (0 < (int)uVar3) {
          iVar11 = this->mode;
          pvVar7 = bottom_blob->data;
          sVar8 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          local_78 = local_68;
          local_80 = 0;
          do {
            if (0 < (int)uVar3) {
              iVar4 = this->upscale_factor;
              uVar18 = 0;
              puVar17 = local_78;
              do {
                if (0 < (int)uVar2) {
                  iVar19 = ((int)local_90 * uVar3 + (int)local_80) * uVar3 + (int)uVar18;
                  if (iVar11 != 0) {
                    iVar19 = (uVar3 * (int)local_80 + (int)uVar18) * _c + (int)local_90;
                  }
                  puVar15 = (undefined4 *)((long)iVar19 * sVar8 * sVar9 + (long)pvVar7);
                  uVar16 = 0;
                  puVar13 = puVar17;
                  do {
                    puVar12 = puVar13;
                    iVar19 = iVar1;
                    if (0 < iVar1) {
                      do {
                        *puVar12 = *puVar15;
                        puVar15 = puVar15 + 1;
                        puVar12 = puVar12 + iVar4;
                        iVar19 = iVar19 + -1;
                      } while (iVar19 != 0);
                    }
                    uVar16 = uVar16 + 1;
                    puVar13 = (undefined4 *)((long)puVar13 + lVar14 * iVar4);
                  } while (uVar16 != uVar2);
                }
                uVar18 = uVar18 + 1;
                puVar17 = puVar17 + 1;
              } while (uVar18 != uVar3);
            }
            local_80 = local_80 + 1;
            local_78 = (undefined4 *)((long)local_78 + lVar14);
          } while (local_80 != uVar3);
        }
        local_90 = local_90 + 1;
        local_68 = (undefined4 *)((long)local_68 + sVar6 * sVar5);
      } while (local_90 != (uVar10 & 0xffffffff));
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int PixelShuffle::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w * upscale_factor;
    int outh = h * upscale_factor;
    int outc = channels / (upscale_factor * upscale_factor);

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outc; p++)
    {
        Mat m = top_blob.channel(p);

        for (int sh = 0; sh < upscale_factor; sh++)
        {
            for (int sw = 0; sw < upscale_factor; sw++)
            {
                int q;
                if (mode == 0)
                    q = p * upscale_factor * upscale_factor + sh * upscale_factor + sw;
                else // if (mode == 1)
                    q = (sh * upscale_factor + sw) * outc + p;

                const float* sptr = bottom_blob.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float* outptr = m.row(i * upscale_factor + sh) + sw;
                    for (int j = 0; j < w; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr++;
                        outptr += upscale_factor;
                    }
                }
            }
        }
    }

    return 0;
}